

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s1_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  pointer pfVar9;
  float fVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  void *pvVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  
  iVar3 = top_blob->c;
  if (0 < (long)iVar3) {
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    pvVar7 = _kernel->data;
    pvVar8 = _bias->data;
    iVar6 = bottom_blob->w;
    lVar13 = 0;
    auVar22._8_4_ = 0x80000000;
    auVar22._0_8_ = 0x8000000080000000;
    auVar22._12_4_ = 0x80000000;
    auVar23._8_4_ = 0x3effffff;
    auVar23._0_8_ = 0x3effffff3effffff;
    auVar23._12_4_ = 0x3effffff;
    do {
      if (pvVar8 == (void *)0x0) {
        fVar24 = 0.0;
      }
      else {
        fVar24 = *(float *)((long)pvVar8 + lVar13 * 4);
      }
      if (0 < iVar5) {
        pvVar21 = (void *)(top_blob->cstep * lVar13 * top_blob->elemsize + (long)top_blob->data);
        pfVar9 = (scales_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar1 = pfVar9[lVar13 * 2];
        fVar2 = pfVar9[lVar13 * 2 + 1];
        pvVar20 = (void *)(bottom_blob->cstep * lVar13 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar11 = lVar13 * 9;
        pvVar15 = (void *)((long)pvVar20 + (long)iVar6 * 2);
        lVar18 = (long)pvVar20 + (long)iVar6;
        iVar19 = 0;
        do {
          if (0 < iVar4) {
            lVar14 = 2;
            lVar12 = 0;
            iVar16 = iVar4 + 1;
            do {
              fVar10 = (fVar1 * (float)((int)*(char *)((long)pvVar7 + lVar11 + 8) *
                                        (int)*(char *)((long)pvVar15 + lVar14) +
                                        (int)*(char *)((long)pvVar7 + lVar11 + 7) *
                                        (int)*(char *)((long)pvVar15 + lVar14 + -1) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 6) *
                                       (int)*(char *)((long)pvVar15 + lVar14 + -2) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 5) *
                                       (int)*(char *)(lVar18 + lVar14) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 4) *
                                       (int)*(char *)(lVar18 + -1 + lVar14) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 3) *
                                       (int)*(char *)(lVar18 + -2 + lVar14) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 2) *
                                       (int)*(char *)((long)pvVar20 + lVar14) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 1) *
                                       (int)*(char *)((long)pvVar20 + lVar14 + -1) +
                                       (int)*(char *)((long)pvVar7 + lVar11) *
                                       (int)*(char *)((long)pvVar20 + lVar14 + -2)) + fVar24) *
                       fVar2;
              auVar25 = vandps_avx(ZEXT416((uint)fVar10),auVar22);
              auVar25 = vorps_avx(auVar25,auVar23);
              auVar25 = ZEXT416((uint)(fVar10 + auVar25._0_4_));
              auVar25 = vroundss_avx(auVar25,auVar25,0xb);
              iVar17 = (int)auVar25._0_4_;
              if (iVar17 < -0x7e) {
                iVar17 = -0x7f;
              }
              if (0x7e < iVar17) {
                iVar17 = 0x7f;
              }
              *(char *)((long)pvVar21 + lVar14 + -2) = (char)iVar17;
              iVar16 = iVar16 + -1;
              lVar12 = lVar12 + -1;
              lVar14 = lVar14 + 1;
            } while (1 < iVar16);
            pvVar15 = (void *)((long)pvVar15 - lVar12);
            lVar18 = lVar18 - lVar12;
            pvVar20 = (void *)((long)pvVar20 - lVar12);
            pvVar21 = (void *)((long)pvVar21 - lVar12);
          }
          pvVar20 = (void *)((long)pvVar20 + 2);
          lVar18 = lVar18 + 2;
          pvVar15 = (void *)((long)pvVar15 + 2);
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar5);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar3);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_requant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2 * p];
        const float scale_requant_out = scales_requant[2 * p + 1];

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}